

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O0

void __thiscall
nodecpp::iibmalloc::
CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,_nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::PageBlockDescriptor>
::deinitialize(CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,_nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::PageBlockDescriptor>
               *this)

{
  anon_class_8_1_8991fb9c local_28;
  ListItem *local_20;
  ListItem *tmp;
  ListItem *pageStartHead;
  CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,_nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_6UL,_23UL,_4UL,_3UL>::PageBlockDescriptor>
  *this_local;
  
  tmp = (ListItem *)0x0;
  pageStartHead = (ListItem *)this;
  collectPageStarts(this,&tmp,this->head);
  collectPageStarts(this,&tmp,this->freeList);
  while (tmp != (ListItem *)0x0) {
    local_20 = tmp->next;
    PageAllocatorWithCaching::freeChunkNoCache(&this->super_PageAllocatorWithCaching,tmp,0x1000);
    this->pageCnt = this->pageCnt - 1;
    tmp = local_20;
  }
  local_28.this = this;
  assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::CollectionInPages<nodecpp::iibmalloc::PageAllocatorWithCaching,nodecpp::iibmalloc::SoundingAddressPageAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,6ul,23ul,4ul,3ul>::PageBlockDescriptor>::deinitialize()::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
             ,0x9d,&local_28,"pageCnt == 0");
  this->head = (ListItem *)0x0;
  this->freeList = (ListItem *)0x0;
  return;
}

Assistant:

void deinitialize()
	{
		ListItem* pageStartHead = nullptr;
		collectPageStarts( &pageStartHead, head );
		collectPageStarts( &pageStartHead, freeList );
		while (pageStartHead)
		{
			ListItem* tmp = pageStartHead->next;
			this->freeChunkNoCache( pageStartHead, PAGE_SIZE_BYTES );
			--pageCnt;
			pageStartHead = tmp;
		}
		NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, pageCnt == 0 );
		head = nullptr;
		freeList = nullptr;
	}